

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosixSerialPort.cpp
# Opt level: O2

ssize_t __thiscall PosixSerialPort::read(PosixSerialPort *this,int __fd,void *__buf,size_t __nbytes)

{
  uint __i;
  int iVar1;
  long lVar2;
  ssize_t sVar3;
  ulong uVar4;
  int iVar5;
  undefined4 in_register_00000034;
  uint uVar6;
  timeval tv;
  fd_set fds;
  
  uVar4 = 0xffffffffffffffff;
  if (this->_devfd != -1) {
    uVar6 = 0;
    while (iVar5 = (int)__buf - uVar6, iVar5 != 0 && (int)uVar6 <= (int)__buf) {
      for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
        fds.fds_bits[lVar2] = 0;
      }
      iVar1 = this->_devfd;
      fds.fds_bits[iVar1 / 0x40] = fds.fds_bits[iVar1 / 0x40] | 1L << ((byte)iVar1 & 0x3f);
      tv.tv_sec = (__time_t)(this->_timeout / 1000);
      tv.tv_usec = (__suseconds_t)((this->_timeout % 1000) * 1000);
      iVar1 = select(iVar1 + 1,(fd_set *)&fds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&tv);
      if (iVar1 < 0) {
        return -1;
      }
      if (iVar1 == 0) break;
      iVar1 = this->_devfd;
      if (((ulong)fds.fds_bits[iVar1 / 0x40] >> ((long)iVar1 % 0x40 & 0x3fU) & 1) != 0) {
        sVar3 = ::read(iVar1,(void *)((ulong)uVar6 + CONCAT44(in_register_00000034,__fd)),
                       (long)iVar5);
        if ((int)sVar3 < 0) {
          return -1;
        }
        uVar6 = uVar6 + (int)sVar3;
      }
    }
    uVar4 = (ulong)uVar6;
  }
  return uVar4;
}

Assistant:

int
PosixSerialPort::read(uint8_t* buffer, int len)
{
    fd_set fds;
    struct timeval tv;
    int numread = 0;
    int retval;

    if (_devfd == -1)
        return -1;

    while (numread < len)
    {
        FD_ZERO(&fds);
        FD_SET(_devfd, &fds);

        tv.tv_sec  = _timeout / 1000;
        tv.tv_usec = (_timeout % 1000) * 1000;

        retval = select(_devfd + 1, &fds, NULL, NULL, &tv);

        if (retval < 0)
        {
            return -1;
        }
        else if (retval == 0)
        {
            return numread;
        }
        else if (FD_ISSET(_devfd, &fds))
        {
            retval = ::read(_devfd, (uint8_t*) buffer + numread, len - numread);
            if (retval < 0)
                return -1;
            numread += retval;
        }
    }

    return numread;
}